

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Type> * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::makeTupleType
          (Result<wasm::Type> *__return_storage_ptr__,
          TypeParserCtx<wasm::WATParser::ParseDefsCtx> *this,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *types)

{
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_38;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_20;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *types_local;
  TypeParserCtx<wasm::WATParser::ParseDefsCtx> *this_local;
  
  local_20 = types;
  types_local = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)this;
  this_local = (TypeParserCtx<wasm::WATParser::ParseDefsCtx> *)__return_storage_ptr__;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_38,types);
  Result<wasm::Type>::Result<std::vector<wasm::Type,std::allocator<wasm::Type>>>
            (__return_storage_ptr__,&local_38);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Result<TypeT> makeTupleType(const std::vector<Type>& types) {
    return Tuple(types);
  }